

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O2

int pcre2_substring_length_byname_16
              (pcre2_match_data_16 *match_data,PCRE2_SPTR16 stringname,size_t *sizeptr)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  PCRE2_SPTR16 last;
  PCRE2_SPTR16 first;
  
  if (match_data->matchedby == 1) {
    return -0x29;
  }
  uVar2 = pcre2_substring_nametable_scan_16(match_data->code,stringname,&first,&last);
  if (-1 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
    uVar2 = 0xffffffca;
    for (; first <= last; first = first + uVar4) {
      uVar1 = *first;
      if (uVar1 < match_data->oveccount) {
        uVar2 = 0xffffffc9;
        if (match_data->ovector[(ulong)uVar1 * 2] != 0xffffffffffffffff) {
          iVar3 = pcre2_substring_length_bynumber_16(match_data,(uint)uVar1,sizeptr);
          return iVar3;
        }
      }
    }
  }
  return uVar2;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_length_byname(pcre2_match_data *match_data,
  PCRE2_SPTR stringname, PCRE2_SIZE *sizeptr)
{
PCRE2_SPTR first, last, entry;
int failrc, entrysize;
if (match_data->matchedby == PCRE2_MATCHEDBY_DFA_INTERPRETER)
  return PCRE2_ERROR_DFA_UFUNC;
entrysize = pcre2_substring_nametable_scan(match_data->code, stringname,
  &first, &last);
if (entrysize < 0) return entrysize;
failrc = PCRE2_ERROR_UNAVAILABLE;
for (entry = first; entry <= last; entry += entrysize)
  {
  uint32_t n = GET2(entry, 0);
  if (n < match_data->oveccount)
    {
    if (match_data->ovector[n*2] != PCRE2_UNSET)
      return pcre2_substring_length_bynumber(match_data, n, sizeptr);
    failrc = PCRE2_ERROR_UNSET;
    }
  }
return failrc;
}